

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * google::protobuf::compiler::js::anon_unknown_0::StripProto
                   (string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar4;
  string *psVar5;
  char *__s;
  long *local_48;
  string *local_40;
  long local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".protodevel","");
  if ((string *)filename->_M_string_length < local_40) {
    __s = ".proto";
  }
  else {
    iVar2 = std::__cxx11::string::compare
                      ((ulong)filename,(long)filename->_M_string_length - (long)local_40,local_40);
    __s = ".proto";
    if (iVar2 == 0) {
      __s = ".protodevel";
    }
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  local_48 = local_38;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar3);
  psVar5 = (string *)filename->_M_string_length;
  if (local_40 <= psVar5) {
    iVar2 = std::__cxx11::string::compare((ulong)filename,(long)psVar5 - (long)local_40,local_40);
    psVar5 = (string *)filename->_M_string_length;
    if (iVar2 == 0) {
      psVar4 = (string *)std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename)
      ;
      goto LAB_00228483;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,psVar5 + (long)pcVar1);
  psVar4 = extraout_RAX;
LAB_00228483:
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
    psVar4 = extraout_RAX_00;
  }
  return psVar4;
}

Assistant:

string StripProto(const string& filename) {
  const char* suffix = HasSuffixString(filename, ".protodevel")
      ? ".protodevel" : ".proto";
  return StripSuffixString(filename, suffix);
}